

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O1

QSize __thiscall QWatermarkLabel::minimumSizeHint(QWatermarkLabel *this)

{
  char cVar1;
  undefined4 uVar2;
  uint uVar3;
  QSize QVar4;
  ulong uVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  double extraout_XMM0_Qa;
  undefined1 auVar7 [16];
  double extraout_XMM1_Qa;
  undefined1 auVar8 [16];
  QPixmap aQStack_38 [24];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QLabel::pixmap((QLabel *)aQStack_38);
  cVar1 = QPixmap::isNull();
  QPixmap::~QPixmap(aQStack_38);
  if (cVar1 == '\0') {
    QLabel::pixmap((QLabel *)aQStack_38);
    uVar2 = QPixmap::deviceIndependentSize();
    auVar8._0_8_ = (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                   extraout_XMM1_Qa;
    auVar8._8_8_ = (double)((ulong)extraout_XMM0_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                   extraout_XMM0_Qa;
    auVar8 = minpd(_DAT_0066f5d0,auVar8);
    auVar7._8_8_ = -(ulong)(-2147483648.0 < auVar8._8_8_);
    auVar7._0_8_ = -(ulong)(-2147483648.0 < auVar8._0_8_);
    uVar3 = movmskpd(uVar2,auVar7);
    uVar5 = 0x8000000000000000;
    if ((uVar3 & 1) != 0) {
      uVar5 = (ulong)(uint)(int)auVar8._0_8_ << 0x20;
    }
    uVar6 = 0x80000000;
    if ((uVar3 & 2) != 0) {
      uVar6 = (ulong)(uint)(int)auVar8._8_8_;
    }
    QVar4 = (QSize)(uVar6 | uVar5);
    QPixmap::~QPixmap(aQStack_38);
  }
  else {
    QVar4 = QWidget::minimumSizeHint((QWidget *)this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return QVar4;
  }
  __stack_chk_fail();
}

Assistant:

QSize minimumSizeHint() const override {
        if (!pixmap().isNull())
            return pixmap().deviceIndependentSize().toSize();
        return QFrame::minimumSizeHint();
    }